

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_get_frame_corrupted(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  long lVar2;
  aom_codec_err_t aVar3;
  undefined8 *puVar4;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar4 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar4 + 1;
  }
  if ((int *)*puVar4 != (int *)0x0) {
    aVar3 = AOM_CODEC_ERROR;
    if ((ctx->frame_worker != (AVxWorker *)0x0) &&
       ((lVar2 = *ctx->frame_worker->data1, *(int *)(lVar2 + 0x58db8) == 0 ||
        (*(long *)(lVar2 + 0x58d78) != 0)))) {
      aVar3 = AOM_CODEC_OK;
      if (ctx->last_show_frame != (RefCntBuffer *)0x0) {
        *(int *)*puVar4 = (ctx->last_show_frame->buf).corrupted;
      }
    }
    return aVar3;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_frame_corrupted(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  int *corrupted = va_arg(args, int *);

  if (corrupted) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      AV1Decoder *const pbi = frame_worker_data->pbi;
      if (pbi->seen_frame_header && pbi->num_output_frames == 0)
        return AOM_CODEC_ERROR;
      if (ctx->last_show_frame != NULL)
        *corrupted = ctx->last_show_frame->buf.corrupted;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}